

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb__HeapWriteExplicit(leb_Heap *leb,leb_Node node,int32_t bitCount,uint32_t bitData)

{
  leb__HeapArgs args;
  leb__HeapArgs local_38;
  
  leb__CreateHeapArgs(&local_38,leb,node,bitCount);
  leb__BitFieldInsert(local_38.bitFieldLSB,local_38.bitOffsetLSB,local_38.bitCountLSB,bitData);
  leb__BitFieldInsert(local_38.bitFieldMSB,0,local_38.bitCountMSB,
                      bitData >> ((byte)local_38.bitCountLSB & 0x1f));
  return;
}

Assistant:

static void
leb__HeapWriteExplicit(
    leb_Heap *leb,
    const leb_Node node,
    int32_t bitCount,
    uint32_t bitData
) {
    leb__HeapArgs args = leb__CreateHeapArgs(leb, node, bitCount);

    leb__BitFieldInsert(args.bitFieldLSB,
                        args.bitOffsetLSB,
                        args.bitCountLSB,
                        bitData);
    leb__BitFieldInsert(args.bitFieldMSB,
                        0u,
                        args.bitCountMSB,
                        bitData >> args.bitCountLSB);
}